

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  byte bVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  LogLevel *pLVar4;
  double *pdVar5;
  float *pfVar6;
  bool bVar7;
  Limit limit;
  uint32_t uVar8;
  int iVar9;
  double dVar10;
  MessageLite *pMVar11;
  string *value_00;
  pair<int,_int> pVar12;
  int64_t iVar13;
  LogMessage *other;
  uint64_t value_01;
  unsigned_long uVar14;
  ulong uVar15;
  FieldDescriptor *pFVar16;
  FieldType FVar17;
  undefined7 in_register_00000011;
  uint uVar18;
  LogLevel LVar19;
  float value_02;
  pair<unsigned_long,_bool> pVar20;
  uint64_t value;
  LogFinisher local_71;
  LogMessage local_70;
  FieldSkipper *local_38;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      uVar18 = (uint)*pbVar2;
      if (-1 < (char)*pbVar2) {
        input->buffer_ = pbVar2 + 1;
        goto LAB_003cf92f;
      }
    }
    else {
      uVar18 = 0;
    }
    iVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
    uVar18 = (uint)iVar13;
    if (iVar13 < 0) {
      return false;
    }
LAB_003cf92f:
    local_38 = field_skipper;
    limit = io::CodedInputStream::PushLimit(input,uVar18);
    switch(extension->type) {
    case '\x01':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
            dVar10 = (double)local_70._0_8_;
            if (!bVar7) {
              return false;
            }
          }
          else {
            dVar10 = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
          }
          AddDouble(this,number,'\x01',extension->is_packed,dVar10,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\x02':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pfVar6 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar6 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar7) {
              return false;
            }
            value_02 = (float)local_70.level_;
          }
          else {
            value_02 = *pfVar6;
            input->buffer_ = (uint8_t *)(pfVar6 + 1);
          }
          AddFloat(this,number,'\x02',extension->is_packed,value_02,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\x03':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar14 = (unsigned_long)(char)*puVar3, -1 < (long)uVar14)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar14 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddInt64(this,number,'\x03',extension->is_packed,uVar14,extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (value_01 = (uint64_t)(char)*puVar3, -1 < (long)value_01)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          value_01 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddUInt64(this,number,'\x04',extension->is_packed,value_01,extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar15 = (ulong)bVar1;
          uVar8 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003cfa30;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar8 = 0;
LAB_003cfa30:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        AddInt32(this,number,'\x05',extension->is_packed,(int32_t)uVar15,extension->descriptor);
      }
      break;
    case '\x06':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
            if (!bVar7) {
              return false;
            }
          }
          else {
            local_70._0_8_ = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
          }
          AddUInt64(this,number,'\x06',extension->is_packed,local_70._0_8_,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\a':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pLVar4 = (LogLevel *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar7) {
              return false;
            }
            LVar19 = local_70.level_;
          }
          else {
            LVar19 = *pLVar4;
            local_70.level_ = LVar19;
            input->buffer_ = (uint8_t *)(pLVar4 + 1);
          }
          AddUInt32(this,number,'\a',extension->is_packed,LVar19,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\b':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar14 = (unsigned_long)(char)*puVar3, -1 < (long)uVar14)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar14 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddBool(this,number,'\b',extension->is_packed,uVar14 != 0,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x55c);
      other = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_70);
      break;
    case '\r':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar15 = (ulong)bVar1;
          uVar8 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003cfa8c;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar8 = 0;
LAB_003cfa8c:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        AddUInt32(this,number,'\r',extension->is_packed,(uint32_t)uVar15,extension->descriptor);
      }
      break;
    case '\x0e':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar9) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          uVar18 = (uint)*pbVar2;
          if ((char)*pbVar2 < '\0') goto LAB_003cfe4a;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar18 = 0;
LAB_003cfe4a:
          iVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          uVar18 = (uint)iVar13;
          if (iVar13 < 0) {
            return false;
          }
        }
        bVar7 = (*(extension->field_5).enum_validity_check.func)
                          ((extension->field_5).enum_validity_check.arg,uVar18);
        if (bVar7) {
          AddEnum(this,number,'\x0e',extension->is_packed,uVar18,extension->descriptor);
        }
        else {
          (*local_38->_vptr_FieldSkipper[4])(local_38,number,(ulong)uVar18);
        }
        iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x0f':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pLVar4 = (LogLevel *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar7) {
              return false;
            }
            LVar19 = local_70.level_;
          }
          else {
            LVar19 = *pLVar4;
            input->buffer_ = (uint8_t *)(pLVar4 + 1);
          }
          AddInt32(this,number,'\x0f',extension->is_packed,LVar19,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\x10':
      iVar9 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar9) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
            dVar10 = (double)local_70._0_8_;
            if (!bVar7) {
              return false;
            }
          }
          else {
            dVar10 = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
          }
          AddInt64(this,number,'\x10',extension->is_packed,(int64_t)dVar10,extension->descriptor);
          iVar9 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar9);
      }
      break;
    case '\x11':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar15 = (ulong)bVar1;
          uVar8 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003cf9cc;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar8 = 0;
LAB_003cf9cc:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        AddInt32(this,number,'\x11',extension->is_packed,
                 -((uint)uVar15 & 1) ^ (uint)(uVar15 >> 1) & 0x7fffffff,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar9 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar9) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (uVar15 = (ulong)(char)*puVar3, -1 < (long)uVar15)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddInt64(this,number,'\x12',extension->is_packed,-(ulong)((uint)uVar15 & 1) ^ uVar15 >> 1,
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)local_70._0_8_,extension->descriptor
               );
    }
    else {
      SetDouble(this,number,'\x01',(double)local_70._0_8_,extension->descriptor);
    }
    break;
  case '\x02':
    pfVar6 = (float *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pfVar6 < 4) {
      bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70.level_ = (LogLevel)*pfVar6;
      input->buffer_ = (uint8_t *)(pfVar6 + 1);
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)local_70.level_,extension->descriptor)
      ;
    }
    else {
      SetFloat(this,number,'\x02',(float)local_70.level_,extension->descriptor);
    }
    break;
  case '\x03':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) &&
       (local_70._0_8_ = SEXT18((char)*puVar3), -1 < (long)local_70._0_8_)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      local_70._0_8_ = pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x03';
LAB_003cf8a8:
      AddInt64(this,number,FVar17,bVar7,local_70._0_8_,pFVar16);
      return true;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x03';
    goto LAB_003cf8c3;
  case '\x04':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (dVar10 = (double)(long)(char)*puVar3, -1 < (long)dVar10))
    {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      dVar10 = (double)pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x04';
LAB_003cf7ea:
      AddUInt64(this,number,FVar17,bVar7,(uint64_t)dVar10,pFVar16);
      return true;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x04';
    goto LAB_003cf805;
  case '\x05':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar15 = (ulong)bVar1;
      uVar8 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003d000a;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar8 = 0;
LAB_003d000a:
      uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
      if ((long)uVar15 < 0) {
        return false;
      }
    }
    local_70.level_ = (LogLevel)uVar15;
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x05';
LAB_003d003a:
      AddInt32(this,number,FVar17,bVar7,local_70.level_,pFVar16);
      return true;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x05';
    goto LAB_003d0054;
  case '\x06':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
    }
    dVar10 = (double)local_70._0_8_;
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x06';
      goto LAB_003cf7ea;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x06';
LAB_003cf805:
    SetUInt64(this,number,FVar17,(uint64_t)dVar10,pFVar16);
    break;
  case '\a':
    puVar3 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
      bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70.level_ = *(undefined4 *)puVar3;
      input->buffer_ = puVar3 + 4;
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\a';
      LVar19 = local_70.level_;
      goto LAB_003d0090;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\a';
    LVar19 = local_70.level_;
    goto LAB_003d00aa;
  case '\b':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (uVar14 = (unsigned_long)(char)*puVar3, -1 < (long)uVar14))
    {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,uVar14 != 0,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',uVar14 != 0,extension->descriptor);
    }
    break;
  case '\t':
    pFVar16 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar17 = '\t';
      goto LAB_003cf615;
    }
    FVar17 = '\t';
LAB_003cf6d5:
    value_00 = MutableString_abi_cxx11_(this,number,FVar17,pFVar16);
    goto LAB_003cf6da;
  case '\n':
    pMVar11 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    iVar9 = input->recursion_budget_;
    input->recursion_budget_ = iVar9 + -1;
    if (iVar9 < 1) {
      return false;
    }
    bVar7 = MessageLite::MergePartialFromCodedStream(pMVar11,input);
    if (!bVar7) {
      return false;
    }
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
      if (input->last_tag_ != number * 8 + 4U) {
        return false;
      }
      return true;
    }
    __assert_fail("recursion_budget_ < recursion_limit_",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
                  ,0x609,
                  "void google::protobuf::io::CodedInputStream::UnsafeDecrementRecursionDepth()");
  case '\v':
    pMVar11 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (iVar9 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      iVar9 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar9 < 0) {
        return false;
      }
    }
    pVar12 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar9);
    if ((long)pVar12 < 0) {
      return false;
    }
    bVar7 = MessageLite::MergePartialFromCodedStream(pMVar11,input);
    if (!bVar7) {
      return false;
    }
    bVar7 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar12.first);
    goto LAB_003cf6e5;
  case '\f':
    pFVar16 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar17 = '\f';
      goto LAB_003cf6d5;
    }
    FVar17 = '\f';
LAB_003cf615:
    value_00 = AddString_abi_cxx11_(this,number,FVar17,pFVar16);
LAB_003cf6da:
    bVar7 = WireFormatLite::ReadBytes(input,value_00);
LAB_003cf6e5:
    if (bVar7 == false) {
      return false;
    }
    break;
  case '\r':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar15 = (ulong)bVar1;
      uVar8 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003d0060;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar8 = 0;
LAB_003d0060:
      uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
      if ((long)uVar15 < 0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\r';
      LVar19 = (LogLevel)uVar15;
LAB_003d0090:
      AddUInt32(this,number,FVar17,bVar7,LVar19,pFVar16);
      return true;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\r';
    LVar19 = (LogLevel)uVar15;
LAB_003d00aa:
    SetUInt32(this,number,FVar17,LVar19,pFVar16);
    break;
  case '\x0e':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      uVar18 = (uint)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_003d012f;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar18 = 0;
LAB_003d012f:
      iVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
      uVar18 = (uint)iVar13;
      if (iVar13 < 0) {
        return false;
      }
    }
    bVar7 = (*(extension->field_5).enum_validity_check.func)
                      ((extension->field_5).enum_validity_check.arg,uVar18);
    if (bVar7) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,uVar18,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',uVar18,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)uVar18);
    }
    break;
  case '\x0f':
    pLVar4 = (LogLevel *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
      bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70.level_ = *pLVar4;
      input->buffer_ = (uint8_t *)(pLVar4 + 1);
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x0f';
      goto LAB_003d003a;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x0f';
    goto LAB_003d0054;
  case '\x10':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_70);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x10';
      goto LAB_003cf8a8;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x10';
    goto LAB_003cf8c3;
  case '\x11':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar15 = (ulong)bVar1;
      uVar8 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003cffa0;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar8 = 0;
LAB_003cffa0:
      uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
      if ((long)uVar15 < 0) {
        return false;
      }
    }
    local_70.level_ = -((uint)uVar15 & 1) ^ (LogLevel)(uVar15 >> 1) & 0x7fffffff;
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x11';
      goto LAB_003d003a;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x11';
LAB_003d0054:
    SetInt32(this,number,FVar17,local_70.level_,pFVar16);
    break;
  case '\x12':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (uVar15 = (ulong)(char)*puVar3, -1 < (long)uVar15)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar15 = pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    local_70._0_8_ = -(ulong)((uint)uVar15 & 1) ^ uVar15 >> 1;
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x12';
      goto LAB_003cf8a8;
    }
    pFVar16 = extension->descriptor;
    FVar17 = '\x12';
LAB_003cf8c3:
    SetInt64(this,number,FVar17,local_70._0_8_,pFVar16);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32_t size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}